

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BST.hpp
# Opt level: O2

unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>_>_>
 __thiscall
supermap::BST<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>::createLikeThis
          (BST<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long> *this)

{
  _func_int **in_RAX;
  
  std::make_unique<supermap::BST<supermap::Key<3ul>,supermap::ByteArray<4ul>,unsigned_long>>();
  (this->
  super_ExtractibleKeyValueStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>).
  super_KeyValueStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>.
  _vptr_KeyValueStorage = in_RAX;
  return (__uniq_ptr_data<supermap::ExtractibleKeyValueStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>_>,_true,_true>
          )(__uniq_ptr_data<supermap::ExtractibleKeyValueStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<ExtractibleKeyValueStorage<Key, Value, IndexT>> createLikeThis() const override {
        return std::make_unique<BST<Key, Value, IndexT>>();
    }